

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie_test.cpp
# Opt level: O0

void basic_test(void)

{
  bool bVar1;
  ostream *poVar2;
  runtime_error *prVar3;
  ostringstream oss_9;
  ostringstream ss_9;
  ostringstream oss_8;
  ostringstream ss_8;
  ostringstream oss_7;
  ostringstream ss_7;
  ostringstream oss_6;
  ostringstream ss_6;
  ostringstream oss_5;
  ostringstream ss_5;
  ostringstream oss_4;
  ostringstream ss_4;
  ostringstream oss_3;
  ostringstream ss_3;
  ostringstream oss_2;
  ostringstream ss_2;
  ostringstream oss_1;
  ostringstream ss_1;
  ostringstream oss;
  ostringstream ss;
  cookie c;
  char *in_stack_ffffffffffffdcb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffdcc0;
  string local_2148 [32];
  ostringstream local_2128 [376];
  string local_1fb0 [32];
  ostringstream local_1f90 [383];
  undefined1 local_1e11;
  string local_1e10 [32];
  ostringstream local_1df0 [376];
  string local_1c78 [32];
  ostringstream local_1c58 [383];
  undefined1 local_1ad9;
  string local_1ad8 [32];
  ostringstream local_1ab8 [376];
  string local_1940 [32];
  ostringstream local_1920 [383];
  undefined1 local_17a1;
  string local_17a0 [32];
  ostringstream local_1780 [376];
  string local_1608 [32];
  ostringstream local_15e8 [383];
  undefined1 local_1469;
  string local_1468 [32];
  ostringstream local_1448 [376];
  string local_12d0 [32];
  ostringstream local_12b0 [383];
  undefined1 local_1131;
  string local_1130 [32];
  ostringstream local_1110 [376];
  string local_f98 [32];
  ostringstream local_f78 [383];
  undefined1 local_df9;
  string local_df8 [32];
  ostringstream local_dd8 [376];
  string local_c60 [32];
  ostringstream local_c40 [383];
  undefined1 local_ac1;
  string local_ac0 [32];
  ostringstream local_aa0 [376];
  string local_928 [32];
  ostringstream local_908 [383];
  undefined1 local_789;
  string local_788 [32];
  ostringstream local_768 [376];
  string local_5f0 [32];
  ostringstream local_5d0 [383];
  undefined1 local_451;
  string local_450 [32];
  ostringstream local_430 [376];
  string local_2b8 [32];
  ostringstream local_298 [383];
  allocator local_119;
  string local_118 [55];
  allocator local_e1;
  string local_e0 [32];
  cookie local_c0 [192];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e0,"a",&local_e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_118,"b",&local_119);
  cppcms::http::cookie::cookie(local_c0,local_e0,local_118);
  std::__cxx11::string::~string(local_118);
  std::allocator<char>::~allocator((allocator<char> *)&local_119);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  std::__cxx11::ostringstream::ostringstream(local_298);
  cppcms::http::operator<<((ostream *)local_298,local_c0);
  std::__cxx11::ostringstream::str();
  bVar1 = std::operator==(in_stack_ffffffffffffdcc0,in_stack_ffffffffffffdcb8);
  std::__cxx11::string::~string(local_2b8);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_430);
    poVar2 = std::operator<<((ostream *)local_430,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cookie_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x2c);
    std::operator<<(poVar2," ss.str()==\"Set-Cookie:a=b; Version=1\"");
    local_451 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar3,local_450);
    local_451 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::ostringstream::~ostringstream(local_298);
  cppcms::http::cookie::httponly(SUB81(local_c0,0));
  std::__cxx11::ostringstream::ostringstream(local_5d0);
  cppcms::http::operator<<((ostream *)local_5d0,local_c0);
  std::__cxx11::ostringstream::str();
  bVar1 = std::operator==(in_stack_ffffffffffffdcc0,in_stack_ffffffffffffdcb8);
  std::__cxx11::string::~string(local_5f0);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_768);
    poVar2 = std::operator<<((ostream *)local_768,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cookie_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x32);
    std::operator<<(poVar2," ss.str()==\"Set-Cookie:a=b; HttpOnly; Version=1\"");
    local_789 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar3,local_788);
    local_789 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::ostringstream::~ostringstream(local_5d0);
  cppcms::http::cookie::samesite_none(SUB81(local_c0,0));
  std::__cxx11::ostringstream::ostringstream(local_908);
  cppcms::http::operator<<((ostream *)local_908,local_c0);
  std::__cxx11::ostringstream::str();
  bVar1 = std::operator==(in_stack_ffffffffffffdcc0,in_stack_ffffffffffffdcb8);
  std::__cxx11::string::~string(local_928);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_aa0);
    poVar2 = std::operator<<((ostream *)local_aa0,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cookie_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x38);
    std::operator<<(poVar2," ss.str()==\"Set-Cookie:a=b; HttpOnly; SameSite=None; Version=1\"");
    local_ac1 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar3,local_ac0);
    local_ac1 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::ostringstream::~ostringstream(local_908);
  cppcms::http::cookie::samesite_lax(SUB81(local_c0,0));
  std::__cxx11::ostringstream::ostringstream(local_c40);
  cppcms::http::operator<<((ostream *)local_c40,local_c0);
  std::__cxx11::ostringstream::str();
  bVar1 = std::operator==(in_stack_ffffffffffffdcc0,in_stack_ffffffffffffdcb8);
  std::__cxx11::string::~string(local_c60);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_dd8);
    poVar2 = std::operator<<((ostream *)local_dd8,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cookie_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x3e);
    std::operator<<(poVar2," ss.str()==\"Set-Cookie:a=b; HttpOnly; SameSite=Lax; Version=1\"");
    local_df9 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar3,local_df8);
    local_df9 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::ostringstream::~ostringstream(local_c40);
  cppcms::http::cookie::samesite_strict(SUB81(local_c0,0));
  std::__cxx11::ostringstream::ostringstream(local_f78);
  cppcms::http::operator<<((ostream *)local_f78,local_c0);
  std::__cxx11::ostringstream::str();
  bVar1 = std::operator==(in_stack_ffffffffffffdcc0,in_stack_ffffffffffffdcb8);
  std::__cxx11::string::~string(local_f98);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_1110);
    poVar2 = std::operator<<((ostream *)local_1110,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cookie_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x44);
    std::operator<<(poVar2," ss.str()==\"Set-Cookie:a=b; HttpOnly; SameSite=Strict; Version=1\"");
    local_1131 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar3,local_1130);
    local_1131 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::ostringstream::~ostringstream(local_f78);
  cppcms::http::cookie::httponly(SUB81(local_c0,0));
  cppcms::http::cookie::samesite_strict(SUB81(local_c0,0));
  std::__cxx11::ostringstream::ostringstream(local_12b0);
  cppcms::http::operator<<((ostream *)local_12b0,local_c0);
  std::__cxx11::ostringstream::str();
  bVar1 = std::operator==(in_stack_ffffffffffffdcc0,in_stack_ffffffffffffdcb8);
  std::__cxx11::string::~string(local_12d0);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_1448);
    poVar2 = std::operator<<((ostream *)local_1448,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cookie_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x4b);
    std::operator<<(poVar2," ss.str()==\"Set-Cookie:a=b; Version=1\"");
    local_1469 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar3,local_1468);
    local_1469 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::ostringstream::~ostringstream(local_12b0);
  cppcms::http::cookie::max_age((uint)local_c0);
  std::__cxx11::ostringstream::ostringstream(local_15e8);
  cppcms::http::operator<<((ostream *)local_15e8,local_c0);
  std::__cxx11::ostringstream::str();
  bVar1 = std::operator==(in_stack_ffffffffffffdcc0,in_stack_ffffffffffffdcb8);
  std::__cxx11::string::~string(local_1608);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_1780);
    poVar2 = std::operator<<((ostream *)local_1780,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cookie_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x51);
    std::operator<<(poVar2," ss.str()==\"Set-Cookie:a=b; Max-Age=10; Version=1\"");
    local_17a1 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar3,local_17a0);
    local_17a1 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::ostringstream::~ostringstream(local_15e8);
  cppcms::http::cookie::expires((long)local_c0);
  std::__cxx11::ostringstream::ostringstream(local_1920);
  cppcms::http::operator<<((ostream *)local_1920,local_c0);
  std::__cxx11::ostringstream::str();
  bVar1 = std::operator==(in_stack_ffffffffffffdcc0,in_stack_ffffffffffffdcb8);
  std::__cxx11::string::~string(local_1940);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_1ab8);
    poVar2 = std::operator<<((ostream *)local_1ab8,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cookie_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x57);
    std::operator<<(poVar2,
                    " ss.str()==\"Set-Cookie:a=b; Max-Age=10; Expires=Thu, 01 Jan 1970 00:00:01 GMT; Version=1\""
                   );
    local_1ad9 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar3,local_1ad8);
    local_1ad9 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::ostringstream::~ostringstream(local_1920);
  std::__cxx11::ostringstream::ostringstream(local_1c58);
  cppcms::http::cookie::browser_age();
  cppcms::http::operator<<((ostream *)local_1c58,local_c0);
  std::__cxx11::ostringstream::str();
  bVar1 = std::operator==(in_stack_ffffffffffffdcc0,in_stack_ffffffffffffdcb8);
  std::__cxx11::string::~string(local_1c78);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_1df0);
    poVar2 = std::operator<<((ostream *)local_1df0,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cookie_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x5d);
    std::operator<<(poVar2," ss.str()==\"Set-Cookie:a=b; Version=1\"");
    local_1e11 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar3,local_1e10);
    local_1e11 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::ostringstream::~ostringstream(local_1c58);
  cppcms::http::cookie::expires((long)local_c0);
  std::__cxx11::ostringstream::ostringstream(local_1f90);
  cppcms::http::operator<<((ostream *)local_1f90,local_c0);
  std::__cxx11::ostringstream::str();
  bVar1 = std::operator==(in_stack_ffffffffffffdcc0,in_stack_ffffffffffffdcb8);
  std::__cxx11::string::~string(local_1fb0);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream(local_2128);
    poVar2 = std::operator<<((ostream *)local_2128,"Error ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/cookie_test.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,99);
    std::operator<<(poVar2,
                    " ss.str()==\"Set-Cookie:a=b; Expires=Thu, 01 Jan 1970 00:00:01 GMT; Version=1\""
                   );
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar3,local_2148);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::ostringstream::~ostringstream(local_1f90);
  cppcms::http::cookie::~cookie(local_c0);
  return;
}

Assistant:

void basic_test()
{
	cppcms::http::cookie c("a","b");
	{
		std::ostringstream ss;
		ss << c;
		TEST(ss.str()=="Set-Cookie:a=b; Version=1");
	}
	{
		c.httponly(true);
		std::ostringstream ss;
		ss << c;
		TEST(ss.str()=="Set-Cookie:a=b; HttpOnly; Version=1");
	}
	{
		c.samesite_none(true);
		std::ostringstream ss;
		ss << c;
		TEST(ss.str()=="Set-Cookie:a=b; HttpOnly; SameSite=None; Version=1");
	}
	{
		c.samesite_lax(true);
		std::ostringstream ss;
		ss << c;
		TEST(ss.str()=="Set-Cookie:a=b; HttpOnly; SameSite=Lax; Version=1");
	}
	{
		c.samesite_strict(true);
		std::ostringstream ss;
		ss << c;
		TEST(ss.str()=="Set-Cookie:a=b; HttpOnly; SameSite=Strict; Version=1");
	}
	{
		c.httponly(false);
		c.samesite_strict(false);
		std::ostringstream ss;
		ss << c;
		TEST(ss.str()=="Set-Cookie:a=b; Version=1");
	}
	{
		c.max_age(10);
		std::ostringstream ss;
		ss << c;
		TEST(ss.str()=="Set-Cookie:a=b; Max-Age=10; Version=1");
	}
	{
		c.expires(1);
		std::ostringstream ss;
		ss << c;
		TEST(ss.str()=="Set-Cookie:a=b; Max-Age=10; Expires=Thu, 01 Jan 1970 00:00:01 GMT; Version=1");
	}
	{
		std::ostringstream ss;
		c.browser_age();
		ss << c;
		TEST(ss.str()=="Set-Cookie:a=b; Version=1");
	}
	{
		c.expires(1);
		std::ostringstream ss;
		ss << c;
		TEST(ss.str()=="Set-Cookie:a=b; Expires=Thu, 01 Jan 1970 00:00:01 GMT; Version=1");
	}
}